

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O3

void __thiscall
despot::Tag::Observe
          (Tag *this,Belief *belief,ACT_TYPE action,
          map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
          *obss)

{
  long *plVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  long *plVar5;
  long lVar6;
  mapped_type *pmVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  OBS_TYPE obs;
  unsigned_long local_38;
  
  plVar5 = (long *)(**(code **)(*(long *)belief + 0x30))(belief);
  lVar9 = *plVar5;
  if (plVar5[1] != lVar9) {
    lVar8 = (long)action;
    uVar11 = 0;
    do {
      lVar9 = *(long *)(lVar9 + uVar11 * 8);
      iVar4 = (**(code **)(*(long *)&this->super_BaseTag + 0x58))(this);
      lVar10 = *(long *)&(this->super_BaseTag).transition_probabilities_.
                         super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar4].
                         super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                         ._M_impl.super__Vector_impl_data;
      lVar6 = *(long *)(lVar10 + lVar8 * 0x18);
      if (*(long *)(lVar10 + 8 + lVar8 * 0x18) != lVar6) {
        plVar1 = (long *)(lVar10 + lVar8 * 0x18);
        lVar10 = 0x18;
        uVar12 = 0;
        do {
          local_38 = (this->obs_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[*(int *)(lVar6 + -0xc + lVar10)];
          dVar2 = *(double *)(lVar9 + 0x18);
          dVar3 = *(double *)(lVar6 + lVar10);
          pmVar7 = std::
                   map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                   ::operator[](obss,&local_38);
          *pmVar7 = dVar2 * dVar3 + *pmVar7;
          uVar12 = uVar12 + 1;
          lVar6 = *plVar1;
          lVar10 = lVar10 + 0x20;
        } while (uVar12 < (ulong)(plVar1[1] - lVar6 >> 5));
      }
      uVar11 = uVar11 + 1;
      lVar9 = *plVar5;
    } while (uVar11 < (ulong)(plVar5[1] - lVar9 >> 3));
  }
  return;
}

Assistant:

void Tag::Observe(const Belief* belief, ACT_TYPE action,
	map<OBS_TYPE, double>& obss) const {
	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();
	for (int i = 0; i < particles.size(); i++) {
		TagState* state = static_cast<TagState*>(particles[i]);
		const vector<State>& distribution = transition_probabilities_[GetIndex(
			state)][action];
		for (int i = 0; i < distribution.size(); i++) {
			const State& next = distribution[i];
			OBS_TYPE obs = obs_[next.state_id];
			double p = state->weight * next.weight;
			obss[obs] += p;
		}
	}
}